

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall MobileElementManager::Delete(MobileElementManager *this,int index)

{
  pointer pdVar1;
  pointer ppVar2;
  int iVar3;
  pointer pdVar4;
  runtime_error *this_00;
  pointer __src;
  long lVar5;
  
  lVar5 = (long)index;
  this->prop_sum_ =
       this->prop_sum_ -
       (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[lVar5];
  iVar3 = std::__cxx11::string::compare
                    ((char *)((long)(this->polymerases_).
                                    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar5].first.
                                    super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr + 0x18));
  if (iVar3 != 0) {
    this->pol_count_ = this->pol_count_ + -1;
  }
  std::
  vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ::_M_erase(&this->polymerases_,
             (this->polymerases_).
             super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5);
  pdVar4 = (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __src = pdVar4 + lVar5 + 1;
  if (__src != pdVar1) {
    memmove(pdVar4 + lVar5,__src,(long)pdVar1 - (long)__src);
  }
  ppVar2 = (this->polymerases_).
           super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pdVar4 = (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar4;
  if ((long)pdVar4 -
      (long)(this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)ppVar2 -
      (long)(this->polymerases_).
            super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Prop list not correct size.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MobileElementManager::Delete(int index) {
  prop_sum_ -= prop_list_[index];
  // Keep running count of non-RNAse mobile elements
  if (polymerases_[index].first->name() != "__rnase") {
    pol_count_ -= 1;
  }
  polymerases_.erase(polymerases_.begin() + index);
  prop_list_.erase(prop_list_.begin() + index);
  if (prop_list_.size() != polymerases_.size()) {
    throw std::runtime_error("Prop list not correct size.");
  }
}